

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O1

void __thiscall sf::WindowBase::setSize(WindowBase *this,Vector2u *size)

{
  if (this->m_impl != (WindowImpl *)0x0) {
    (*this->m_impl->_vptr_WindowImpl[6])();
    this->m_size = *size;
    (*this->_vptr_WindowBase[6])(this);
    return;
  }
  return;
}

Assistant:

void WindowBase::setSize(const Vector2u& size)
{
    if (m_impl)
    {
        m_impl->setSize(size);

        // Cache the new size
        m_size.x = size.x;
        m_size.y = size.y;

        // Notify the derived class
        onResize();
    }
}